

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O3

void __thiscall Fl_Help_View::add_link(Fl_Help_View *this,char *n,int xx,int yy,int ww,int hh)

{
  Fl_Help_Link *dst;
  int iVar1;
  Fl_Help_Link *pFVar2;
  char *pcVar3;
  int iVar4;
  
  iVar4 = this->nlinks_;
  iVar1 = this->alinks_;
  if (iVar4 < iVar1) {
    pFVar2 = this->links_;
  }
  else {
    this->alinks_ = (int)((long)iVar1 + 0x10);
    if (iVar1 == 0) {
      pFVar2 = (Fl_Help_Link *)malloc(0xf00);
      this->links_ = pFVar2;
    }
    else {
      pFVar2 = (Fl_Help_Link *)realloc(this->links_,((long)iVar1 + 0x10) * 0xf0);
      this->links_ = pFVar2;
      iVar4 = this->nlinks_;
    }
  }
  dst = pFVar2 + iVar4;
  pFVar2[iVar4].x = xx;
  pFVar2[iVar4].y = yy;
  pFVar2[iVar4].w = ww + xx;
  pFVar2[iVar4].h = hh + yy;
  fl_strlcpy(dst->filename,n,0xc0);
  pcVar3 = strrchr(dst->filename,0x23);
  if (pcVar3 == (char *)0x0) {
    dst->name[0] = '\0';
  }
  else {
    *pcVar3 = '\0';
    fl_strlcpy(dst->name,pcVar3 + 1,0x20);
  }
  this->nlinks_ = this->nlinks_ + 1;
  return;
}

Assistant:

void Fl_Help_View::add_link(const char *n,	// I - Name of link
                      int        xx,	// I - X position of link
		      int        yy,	// I - Y position of link
		      int        ww,	// I - Width of link text
		      int        hh)	// I - Height of link text
{
  Fl_Help_Link	*temp;			// New link
  char		*target;		// Pointer to target name


  if (nlinks_ >= alinks_)
  {
    alinks_ += 16;

    if (alinks_ == 16)
      links_ = (Fl_Help_Link *)malloc(sizeof(Fl_Help_Link) * alinks_);
    else
      links_ = (Fl_Help_Link *)realloc(links_, sizeof(Fl_Help_Link) * alinks_);
  }

  temp = links_ + nlinks_;

  temp->x       = xx;
  temp->y       = yy;
  temp->w       = xx + ww;
  temp->h       = yy + hh;

  strlcpy(temp->filename, n, sizeof(temp->filename));

  if ((target = strrchr(temp->filename, '#')) != NULL)
  {
    *target++ = '\0';
    strlcpy(temp->name, target, sizeof(temp->name));
  }
  else
    temp->name[0] = '\0';

  nlinks_ ++;
}